

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O0

Element __thiscall
ftxui::anon_unknown_5::ResizableSplitRightBase::Render(ResizableSplitRightBase *this)

{
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Element EVar2;
  shared_ptr<ftxui::Node> *local_190;
  Decorator local_150;
  allocator<std::shared_ptr<ftxui::Node>_> local_12a;
  undefined1 local_129;
  Decorator local_128;
  Element local_108;
  Decorator local_f8;
  Element local_d8;
  Decorator local_c8;
  Element local_98;
  ftxui *local_88;
  undefined1 local_80 [32];
  ftxui local_60 [16];
  shared_ptr<ftxui::Node> local_50;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_40;
  Element local_28;
  ResizableSplitRightBase *this_local;
  
  local_129 = 1;
  local_88 = (ftxui *)local_80;
  this_local = this;
  peVar1 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x38));
  (*peVar1->_vptr_ComponentBase[2])(&local_98);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_c8,xflex
            );
  operator|((ftxui *)local_80,&local_98,&local_c8);
  local_88 = (ftxui *)(local_80 + 0x10);
  separator();
  reflect(&local_f8,(Box *)(in_RSI + 0x58));
  operator|((ftxui *)(local_80 + 0x10),&local_d8,&local_f8);
  local_88 = local_60;
  peVar1 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x28));
  (*peVar1->_vptr_ComponentBase[2])(&local_108);
  ftxui::size(&local_128,WIDTH,EQUAL,**(int **)(in_RSI + 0x48));
  operator|(local_60,&local_108,&local_128);
  local_129 = 0;
  local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_12a);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_40,__l,&local_12a);
  hbox((ftxui *)&local_28,&local_40);
  reflect(&local_150,(Box *)(in_RSI + 0x68));
  operator|((ftxui *)this,&local_28,&local_150);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_150);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_28);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_40);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_12a);
  local_190 = &local_50;
  do {
    local_190 = local_190 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_190);
  } while (local_190 != (shared_ptr<ftxui::Node> *)local_80);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_128);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_108);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_f8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_d8);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_c8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_98);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() final {
    return hbox({
               child_->Render() | xflex,
               separator() | reflect(separator_box_),
               main_->Render() | size(WIDTH, EQUAL, *main_size_),
           }) |
           reflect(global_box_);
  }